

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BeagleCPUImpl.hpp
# Opt level: O0

void __thiscall
beagle::cpu::BeagleCPUImpl<double,_1,_1>::calcPrePartialsStates
          (BeagleCPUImpl<double,_1,_1> *this,double *destP,double *partials1,double *matrices1,
          int *states2,double *matrices2,int startPattern,int endPattern)

{
  int iVar1;
  int iVar2;
  double dVar3;
  int iVar4;
  long lVar5;
  int iVar6;
  long in_RCX;
  ulong *puVar7;
  long in_RDX;
  long in_RSI;
  double *in_RDI;
  long in_R8;
  long in_R9;
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  int in_stack_00000008;
  int in_stack_00000010;
  int j;
  double MjPj;
  double *matrices1Ptr;
  int i;
  int state2;
  int w;
  int k;
  double *destPtr;
  double *partials1Ptr;
  int matrixOffset;
  int v;
  int l;
  double *tmpdestPtr;
  int stateCountModFour;
  int matrixIncr;
  double *in_stack_ffffffffffffff68;
  int local_84;
  int local_70;
  int local_68;
  int local_64;
  ulong *local_60;
  long local_58;
  int local_48;
  ulong *local_40;
  
  iVar6 = *(int *)((long)in_RDI + 0x24) + 1;
  iVar1 = *(int *)((long)in_RDI + 0x24);
  std::fill<double*,int>(in_RDI,in_stack_ffffffffffffff68,(int *)0x1a42d8);
  for (local_48 = 0; local_48 < *(int *)((long)in_RDI + 0x34); local_48 = local_48 + 1) {
    iVar4 = local_48 * *(int *)((long)in_RDI + 0x2c) * *(int *)((long)in_RDI + 0x14) +
            *(int *)((long)in_RDI + 0x2c) * in_stack_00000008;
    iVar2 = *(int *)(in_RDI + 8);
    local_58 = in_RDX + (long)iVar4 * 8;
    local_60 = (ulong *)(in_RSI + (long)iVar4 * 8);
    for (local_64 = in_stack_00000008; local_64 < in_stack_00000010; local_64 = local_64 + 1) {
      local_68 = local_48 * *(int *)(in_RDI + 8);
      iVar4 = *(int *)(in_R8 + (long)local_64 * 4);
      for (local_70 = 0; local_70 < *(int *)((long)in_RDI + 0x24); local_70 = local_70 + 1) {
        lVar5 = in_RCX + (long)(local_48 * iVar2) * 8 + (long)(local_70 * iVar6) * 8;
        local_40 = local_60;
        dVar3 = *(double *)(in_R9 + (long)(local_68 + iVar4) * 8) *
                *(double *)(local_58 + (long)local_70 * 8);
        for (local_84 = 0; local_84 < iVar1 / 4 << 2; local_84 = local_84 + 4) {
          auVar13._8_8_ = 0;
          auVar13._0_8_ = *(ulong *)(lVar5 + (long)local_84 * 8);
          auVar8._8_8_ = 0;
          auVar8._0_8_ = dVar3;
          auVar18._8_8_ = 0;
          auVar18._0_8_ = *local_40;
          auVar8 = vfmadd213sd_fma(auVar8,auVar13,auVar18);
          *local_40 = auVar8._0_8_;
          auVar14._8_8_ = 0;
          auVar14._0_8_ = *(ulong *)(lVar5 + (long)(local_84 + 1) * 8);
          auVar9._8_8_ = 0;
          auVar9._0_8_ = dVar3;
          auVar19._8_8_ = 0;
          auVar19._0_8_ = local_40[1];
          auVar8 = vfmadd213sd_fma(auVar9,auVar14,auVar19);
          local_40[1] = auVar8._0_8_;
          auVar15._8_8_ = 0;
          auVar15._0_8_ = *(ulong *)(lVar5 + (long)(local_84 + 2) * 8);
          auVar10._8_8_ = 0;
          auVar10._0_8_ = dVar3;
          puVar7 = local_40 + 3;
          auVar20._8_8_ = 0;
          auVar20._0_8_ = local_40[2];
          auVar8 = vfmadd213sd_fma(auVar10,auVar15,auVar20);
          local_40[2] = auVar8._0_8_;
          auVar16._8_8_ = 0;
          auVar16._0_8_ = *(ulong *)(lVar5 + (long)(local_84 + 3) * 8);
          auVar11._8_8_ = 0;
          auVar11._0_8_ = dVar3;
          local_40 = local_40 + 4;
          auVar21._8_8_ = 0;
          auVar21._0_8_ = *puVar7;
          auVar8 = vfmadd213sd_fma(auVar11,auVar16,auVar21);
          *puVar7 = auVar8._0_8_;
        }
        for (; local_84 < *(int *)((long)in_RDI + 0x24); local_84 = local_84 + 1) {
          auVar17._8_8_ = 0;
          auVar17._0_8_ = *(ulong *)(lVar5 + (long)local_84 * 8);
          auVar12._8_8_ = 0;
          auVar12._0_8_ = dVar3;
          auVar22._8_8_ = 0;
          auVar22._0_8_ = *local_40;
          auVar8 = vfmadd213sd_fma(auVar12,auVar17,auVar22);
          *local_40 = auVar8._0_8_;
          local_40 = local_40 + 1;
        }
        local_68 = iVar6 + local_68;
      }
      local_60 = local_60 + *(int *)((long)in_RDI + 0x2c);
      local_58 = local_58 + (long)*(int *)((long)in_RDI + 0x2c) * 8;
    }
  }
  return;
}

Assistant:

BEAGLE_CPU_TEMPLATE
void BeagleCPUImpl<BEAGLE_CPU_GENERIC>::calcPrePartialsStates(REALTYPE* destP,
                                                              const REALTYPE* partials1,
                                                              const REALTYPE* matrices1,
                                                              const int* states2,
                                                              const REALTYPE* matrices2,
                                                              int startPattern,
                                                              int endPattern) {
    int matrixIncr = kStateCount;

    // increment for the extra column at the end
    matrixIncr += T_PAD;

    int stateCountModFour = (kStateCount / 4) * 4;
    REALTYPE* tmpdestPtr = destP;
    //clean up the partial first, set every entry to 0
    std::fill(tmpdestPtr, tmpdestPtr + kPartialsSize, 0);

#pragma omp parallel for num_threads(kCategoryCount)
    for (int l = 0; l < kCategoryCount; l++) {
        int v = l*kPartialsPaddedStateCount*kPatternCount + kPartialsPaddedStateCount*startPattern;
        int matrixOffset = l*kMatrixSize;
        const REALTYPE* partials1Ptr = &partials1[v];

        REALTYPE* destPtr = &destP[v];
        tmpdestPtr = destPtr;
        for (int k = startPattern; k < endPattern; k++) {
            int w = l * kMatrixSize;
            int state2 = states2[k];
            for (int i = 0; i < kStateCount; i++) {
                const REALTYPE* matrices1Ptr = matrices1 + matrixOffset + i * matrixIncr;

                tmpdestPtr = destPtr;
                const REALTYPE  MjPj = matrices2[w + state2] * partials1Ptr[i];

                int j = 0;
                for (; j < stateCountModFour; j += 4) {
                    *(tmpdestPtr++) += matrices1Ptr[j + 0] * MjPj;

                    *(tmpdestPtr++) += matrices1Ptr[j + 1] * MjPj;

                    *(tmpdestPtr++) += matrices1Ptr[j + 2] * MjPj;

                    *(tmpdestPtr++) += matrices1Ptr[j + 3] * MjPj;
                }

                for (; j < kStateCount; j++) {
                    *(tmpdestPtr++) += matrices1Ptr[j] * MjPj;
                }

                w += matrixIncr;
            }
            destPtr +=kPartialsPaddedStateCount;
            partials1Ptr += kPartialsPaddedStateCount;
        }
    }

}